

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O3

void __thiscall
JsUtil::BackgroundJobProcessor::AddManager(BackgroundJobProcessor *this,JobManager *manager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x315,"(manager)","manager");
    if (!bVar2) goto LAB_0067c107;
    *puVar3 = 0;
  }
  if (this->threadCount != 0) {
    uVar4 = 0;
    do {
      (*manager->_vptr_JobManager[4])
                (manager,&this->parallelThreadData[uVar4]->backgroundPageAllocator);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->threadCount);
  }
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  if ((this->super_JobProcessor).isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x31d,"(!IsClosed())","!IsClosed()");
    if (!bVar2) {
LAB_0067c107:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  JobProcessor::AddManager(&this->super_JobProcessor,manager);
  IndicateNewJob(this);
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return;
}

Assistant:

void BackgroundJobProcessor::AddManager(JobManager *const manager)
    {
        Assert(manager);

        IterateBackgroundThreads([&manager](ParallelThreadData *threadData){
            manager->ProcessorThreadSpecificCallBack(threadData->GetPageAllocator());
            return false;
        });

        AutoCriticalSection lock(&criticalSection);
        Assert(!IsClosed());

        JobProcessor::AddManager(manager);


        IndicateNewJob();
    }